

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

iterator __thiscall CP::vector<int>::insert(vector<int> *this,iterator it,int *element)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  lVar4 = (long)it - (long)this->mData;
  uVar2 = this->mSize + 1;
  if (this->mCap < uVar2) {
    uVar3 = this->mCap * 2;
    if (uVar3 <= uVar2) {
      uVar3 = uVar2;
    }
    expand(this,uVar3);
  }
  uVar2 = this->mSize;
  if ((ulong)(lVar4 >> 2) < uVar2) {
    piVar1 = this->mData;
    uVar3 = uVar2;
    do {
      piVar1[uVar3] = piVar1[uVar3 - 1];
      uVar3 = uVar3 - 1;
    } while ((ulong)(lVar4 >> 2) < uVar3);
  }
  piVar1 = this->mData;
  *(int *)((long)piVar1 + lVar4) = *element;
  this->mSize = uVar2 + 1;
  return (iterator)((long)piVar1 + lVar4);
}

Assistant:

iterator insert(iterator it,const T& element) {
      size_t pos = it - begin();
      ensureCapacity(mSize + 1);
      for(size_t i = mSize;i > pos;i--) {
        mData[i] = mData[i-1];
      }
      mData[pos] = element;
      mSize++;
      return begin()+pos;
    }